

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_destroy_cstr_index(opj_codestream_index_t *p_cstr_ind)

{
  void *in_RDI;
  OPJ_UINT32 it_tile;
  undefined4 local_c;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x20) != 0) {
      free(*(void **)((long)in_RDI + 0x20));
      *(undefined8 *)((long)in_RDI + 0x20) = 0;
    }
    if (*(long *)((long)in_RDI + 0x30) != 0) {
      for (local_c = 0; local_c < *(uint *)((long)in_RDI + 0x2c); local_c = local_c + 1) {
        if (*(long *)(*(long *)((long)in_RDI + 0x30) + (ulong)local_c * 0x38 + 0x30) != 0) {
          free(*(void **)(*(long *)((long)in_RDI + 0x30) + (ulong)local_c * 0x38 + 0x30));
          *(undefined8 *)(*(long *)((long)in_RDI + 0x30) + (ulong)local_c * 0x38 + 0x30) = 0;
        }
        if (*(long *)(*(long *)((long)in_RDI + 0x30) + (ulong)local_c * 0x38 + 0x10) != 0) {
          free(*(void **)(*(long *)((long)in_RDI + 0x30) + (ulong)local_c * 0x38 + 0x10));
          *(undefined8 *)(*(long *)((long)in_RDI + 0x30) + (ulong)local_c * 0x38 + 0x10) = 0;
        }
        if (*(long *)(*(long *)((long)in_RDI + 0x30) + (ulong)local_c * 0x38 + 0x20) != 0) {
          free(*(void **)(*(long *)((long)in_RDI + 0x30) + (ulong)local_c * 0x38 + 0x20));
          *(undefined8 *)(*(long *)((long)in_RDI + 0x30) + (ulong)local_c * 0x38 + 0x20) = 0;
        }
      }
      free(*(void **)((long)in_RDI + 0x30));
      *(undefined8 *)((long)in_RDI + 0x30) = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void j2k_destroy_cstr_index (opj_codestream_index_t *p_cstr_ind)
{
	if (p_cstr_ind) {

		if (p_cstr_ind->marker) {
			opj_free(p_cstr_ind->marker);
			p_cstr_ind->marker = NULL;
		}

		if (p_cstr_ind->tile_index) {
			OPJ_UINT32 it_tile = 0;

			for (it_tile=0; it_tile < p_cstr_ind->nb_of_tiles; it_tile++) {

				if(p_cstr_ind->tile_index[it_tile].packet_index) {
					opj_free(p_cstr_ind->tile_index[it_tile].packet_index);
					p_cstr_ind->tile_index[it_tile].packet_index = NULL;
				}

				if(p_cstr_ind->tile_index[it_tile].tp_index){
					opj_free(p_cstr_ind->tile_index[it_tile].tp_index);
					p_cstr_ind->tile_index[it_tile].tp_index = NULL;
				}

				if(p_cstr_ind->tile_index[it_tile].marker){
					opj_free(p_cstr_ind->tile_index[it_tile].marker);
					p_cstr_ind->tile_index[it_tile].marker = NULL;

				}
			}

			opj_free( p_cstr_ind->tile_index);
			p_cstr_ind->tile_index = NULL;
		}

		opj_free(p_cstr_ind);
	}
}